

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

bool __thiscall FOptionMenuItemCommand::Activate(FOptionMenuItemCommand *this)

{
  FSoundID local_c;
  
  local_c.ID = S_FindSound("menu/choose");
  S_Sound(0x22,&local_c,snd_menuvolume.Value,0.0);
  C_DoCommand(FName::NameData.NameArray
              [(this->super_FOptionMenuItemSubmenu).super_FOptionMenuItem.super_FListMenuItem.
               mAction.Index].Text,0);
  return true;
}

Assistant:

bool Activate()
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		C_DoCommand(mAction);
		return true;
	}